

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckAlign(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  int iVar2;
  ctmbstr local_48;
  ctmbstr values [5];
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  values[4] = (ctmbstr)attval;
  memcpy(&local_48,&DAT_001e0cd0,0x28);
  if ((node->tag == (Dict *)0x0) || ((node->tag->model & 0x10000) == 0)) {
    if ((values[4] == (ctmbstr)0x0) || (*(long *)(values[4] + 0x30) == 0)) {
      prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x256);
    }
    else {
      CheckLowerCaseAttrValue(doc,node,(AttVal *)values[4]);
      if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
          (node->tag->id != TidyTag_CAPTION)) &&
         ((BVar1 = AttrValueIsAmong((AttVal *)values[4],&local_48), BVar1 == no &&
          (((values[4] == (ctmbstr)0x0 || (*(long *)(values[4] + 0x30) == 0)) ||
           ((iVar2 = prvTidytmbstrcasecmp(*(ctmbstr *)(values[4] + 0x30),"char"), iVar2 != 0 ||
            (BVar1 = prvTidynodeHasCM(node,0x280), BVar1 == no)))))))) {
        prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x22b);
      }
    }
  }
  else {
    CheckValign(doc,node,(AttVal *)values[4]);
  }
  return;
}

Assistant:

void CheckAlign( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const values[] = {"left", "right", "center", "justify", NULL};

    /* IMG, OBJECT, APPLET and EMBED use align for vertical position */
    if (node->tag && (node->tag->model & CM_IMG))
    {
        CheckValign( doc, node, attval );
        return;
    }

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    CheckLowerCaseAttrValue( doc, node, attval);

    /* currently CheckCaption(...) takes care of the remaining cases */
    if (nodeIsCAPTION(node))
        return;

    if (!AttrValueIsAmong(attval, values))
    {
        /* align="char" is allowed for elements with CM_TABLE|CM_ROW
           except CAPTION which is excluded above, */
        if( !(AttrValueIs(attval, "char")
              && TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)) )
             TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
}